

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O0

void __thiscall
cmIncludeDirectoryCommand::NormalizeInclude(cmIncludeDirectoryCommand *this,string *inc)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  string local_48 [8];
  string tmp;
  size_type e;
  size_type b;
  string *inc_local;
  cmIncludeDirectoryCommand *this_local;
  
  uVar2 = std::__cxx11::string::find_first_not_of((char *)inc,0x8b660a);
  tmp.field_2._8_8_ = std::__cxx11::string::find_last_not_of((char *)inc,0x8b660a);
  if ((uVar2 == 0xffffffffffffffff) || (tmp.field_2._8_8_ == -1)) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::assign((string *)inc,(ulong)inc,uVar2);
    bVar1 = cmSystemTools::IsOff(inc);
    if (!bVar1) {
      cmsys::SystemTools::ConvertToUnixSlashes(inc);
      bVar1 = cmsys::SystemTools::FileIsFullPath(inc);
      if ((!bVar1) && (bVar1 = cmGeneratorExpression::StartsWithGeneratorExpression(inc), !bVar1)) {
        psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
        std::__cxx11::string::string(local_48,(string *)psVar3);
        std::__cxx11::string::operator+=(local_48,"/");
        std::__cxx11::string::operator+=(local_48,(string *)inc);
        std::__cxx11::string::operator=((string *)inc,local_48);
        std::__cxx11::string::~string(local_48);
      }
    }
  }
  return;
}

Assistant:

void cmIncludeDirectoryCommand::NormalizeInclude(std::string& inc)
{
  std::string::size_type b = inc.find_first_not_of(" \r");
  std::string::size_type e = inc.find_last_not_of(" \r");
  if ((b != std::string::npos) && (e != std::string::npos)) {
    inc.assign(inc, b, 1 + e - b); // copy the remaining substring
  } else {
    inc.clear();
    return;
  }

  if (!cmSystemTools::IsOff(inc)) {
    cmSystemTools::ConvertToUnixSlashes(inc);

    if (!cmSystemTools::FileIsFullPath(inc)) {
      if (!cmGeneratorExpression::StartsWithGeneratorExpression(inc)) {
        std::string tmp = this->Makefile->GetCurrentSourceDirectory();
        tmp += "/";
        tmp += inc;
        inc = tmp;
      }
    }
  }
}